

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-split.cpp
# Opt level: O0

ProfileData *
anon_unknown.dwarf_41187::readProfile(ProfileData *__return_storage_ptr__,string *file)

{
  string *psVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  string *psVar5;
  ulong local_88;
  undefined1 local_80 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> timestamps;
  uint64_t hash;
  anon_class_24_3_ef786fa9 readi32;
  size_t i;
  vector<char,_std::allocator<char>_> profileData;
  string *file_local;
  
  ::wasm::read_file<std::vector<char,std::allocator<char>>>((string *)&i,(BinaryOption)file);
  readi32.file = (string *)0x0;
  hash = (uint64_t)&readi32.file;
  readi32.i = &i;
  readi32.profileData = (vector<char,_std::allocator<char>_> *)file;
  uVar2 = readProfile::anon_class_24_3_ef786fa9::operator()((anon_class_24_3_ef786fa9 *)&hash);
  uVar3 = readProfile::anon_class_24_3_ef786fa9::operator()((anon_class_24_3_ef786fa9 *)&hash);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_80);
  while( true ) {
    psVar1 = readi32.file;
    psVar5 = (string *)
             std::vector<char,_std::allocator<char>_>::size
                       ((vector<char,_std::allocator<char>_> *)&i);
    if (psVar5 <= psVar1) break;
    uVar4 = readProfile::anon_class_24_3_ef786fa9::operator()((anon_class_24_3_ef786fa9 *)&hash);
    local_88 = (ulong)uVar4;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_80,&local_88);
  }
  __return_storage_ptr__->hash = CONCAT44(uVar3,uVar2);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&__return_storage_ptr__->timestamps,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_80);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_80);
  std::vector<char,_std::allocator<char>_>::~vector((vector<char,_std::allocator<char>_> *)&i);
  return __return_storage_ptr__;
}

Assistant:

ProfileData readProfile(const std::string& file) {
  auto profileData = read_file<std::vector<char>>(file, Flags::Binary);
  size_t i = 0;
  auto readi32 = [&]() {
    if (i + 4 > profileData.size()) {
      Fatal() << "Unexpected end of profile data in " << file;
    }
    uint32_t i32 = 0;
    i32 |= uint32_t(uint8_t(profileData[i++]));
    i32 |= uint32_t(uint8_t(profileData[i++])) << 8;
    i32 |= uint32_t(uint8_t(profileData[i++])) << 16;
    i32 |= uint32_t(uint8_t(profileData[i++])) << 24;
    return i32;
  };

  uint64_t hash = readi32();
  hash |= uint64_t(readi32()) << 32;

  std::vector<size_t> timestamps;
  while (i < profileData.size()) {
    timestamps.push_back(readi32());
  }

  return {hash, timestamps};
}